

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_resize
                (uchar *pixels,int type,int w,int h,int target_width,int target_height,
                Allocator *allocator)

{
  uint uVar1;
  uint in_EDX;
  Mat *in_RDI;
  int type_from;
  int in_stack_00000168;
  int in_stack_0000016c;
  int in_stack_00000170;
  int in_stack_00000174;
  uchar *in_stack_00000178;
  int in_stack_00000300;
  int in_stack_00000308;
  Allocator *in_stack_00000310;
  
  uVar1 = in_EDX & 0xffff;
  if ((uVar1 == 1) || (uVar1 == 2)) {
    from_pixels_resize(in_stack_00000178,in_stack_00000174,in_stack_00000170,in_stack_0000016c,
                       in_stack_00000168,in_stack_00000300,in_stack_00000308,in_stack_00000310);
  }
  else if (uVar1 == 3) {
    from_pixels_resize(in_stack_00000178,in_stack_00000174,in_stack_00000170,in_stack_0000016c,
                       in_stack_00000168,in_stack_00000300,in_stack_00000308,in_stack_00000310);
  }
  else if ((uVar1 == 4) || (uVar1 == 5)) {
    from_pixels_resize(in_stack_00000178,in_stack_00000174,in_stack_00000170,in_stack_0000016c,
                       in_stack_00000168,in_stack_00000300,in_stack_00000308,in_stack_00000310);
  }
  else {
    fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
    fprintf(_stderr,"\n");
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int target_width, int target_height, Allocator* allocator)
{
    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 3, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 1, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 4, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}